

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitAtomicFence(BinaryInstWriter *this,AtomicFence *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint8_t local_1b;
  uchar local_1a [2];
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_1a[1] = 0xfe;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,local_1a + 1);
  local_1a[0] = '\x03';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,local_1a);
  local_1b = curr->order;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_1b);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicFence(AtomicFence* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix) << int8_t(BinaryConsts::AtomicFence)
    << int8_t(curr->order);
}